

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexBuffer.cpp
# Opt level: O1

bool __thiscall
sf::VertexBuffer::update(VertexBuffer *this,Vertex *vertices,size_t vertexCount,uint offset)

{
  bool bVar1;
  GLenum GVar2;
  TransientContextLock contextLock;
  TransientContextLock local_29;
  
  bVar1 = false;
  if ((vertices != (Vertex *)0x0) && (bVar1 = false, this->m_buffer != 0)) {
    if ((offset == 0) || (vertexCount + offset <= this->m_size)) {
      GlResource::TransientContextLock::TransientContextLock(&local_29);
      (*sf_ptrc_glBindBufferARB)(0x8892,this->m_buffer);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/VertexBuffer.cpp"
                         ,0xb8,"GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, m_buffer)");
      if (this->m_size <= vertexCount) {
        GVar2 = 0x88e4;
        if (this->m_usage != Static) {
          GVar2 = (uint)(this->m_usage == Dynamic) * 8 + 0x88e0;
        }
        (*sf_ptrc_glBufferDataARB)(0x8892,vertexCount * 0x14,(void *)0x0,GVar2);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/VertexBuffer.cpp"
                           ,0xbd,
                           "GLEXT_glBufferData(GLEXT_GL_ARRAY_BUFFER, sizeof(Vertex) * vertexCount, 0, usageToGlEnum(m_usage))"
                          );
        this->m_size = vertexCount;
      }
      (*sf_ptrc_glBufferSubDataARB)(0x8892,(ulong)offset * 0x14,vertexCount * 0x14,vertices);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/VertexBuffer.cpp"
                         ,0xc2,
                         "GLEXT_glBufferSubData(GLEXT_GL_ARRAY_BUFFER, sizeof(Vertex) * offset, sizeof(Vertex) * vertexCount, vertices)"
                        );
      (*sf_ptrc_glBindBufferARB)(0x8892,0);
      priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/VertexBuffer.cpp"
                         ,0xc4,"GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, 0)");
      GlResource::TransientContextLock::~TransientContextLock(&local_29);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool VertexBuffer::update(const Vertex* vertices, std::size_t vertexCount, unsigned int offset)
{
    // Sanity checks
    if (!m_buffer)
        return false;

    if (!vertices)
        return false;

    if (offset && (offset + vertexCount > m_size))
        return false;

    TransientContextLock contextLock;

    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, m_buffer));

    // Check if we need to resize or orphan the buffer
    if (vertexCount >= m_size)
    {
        glCheck(GLEXT_glBufferData(GLEXT_GL_ARRAY_BUFFER, sizeof(Vertex) * vertexCount, 0, usageToGlEnum(m_usage)));

        m_size = vertexCount;
    }

    glCheck(GLEXT_glBufferSubData(GLEXT_GL_ARRAY_BUFFER, sizeof(Vertex) * offset, sizeof(Vertex) * vertexCount, vertices));

    glCheck(GLEXT_glBindBuffer(GLEXT_GL_ARRAY_BUFFER, 0));

    return true;
}